

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

AggregateFunctionSet * duckdb::ArgMinNullFun::GetFunctions(void)

{
  vector<duckdb::LogicalType,_true> *__range2;
  AggregateFunctionSet *in_RDI;
  LogicalType *by_type;
  element_type *by_type_00;
  vector<duckdb::LogicalType,_true> by_types;
  LogicalType local_48;
  LogicalType local_30;
  
  AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  LogicalType::LogicalType(&local_48,INTEGER);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,int>(in_RDI,&local_48);
  LogicalType::~LogicalType(&local_48);
  LogicalType::LogicalType(&local_48,BIGINT);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,long>(in_RDI,&local_48);
  LogicalType::~LogicalType(&local_48);
  LogicalType::LogicalType(&local_48,DOUBLE);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,double>(in_RDI,&local_48);
  LogicalType::~LogicalType(&local_48);
  LogicalType::LogicalType(&local_48,VARCHAR);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::string_t>
            (in_RDI,&local_48);
  LogicalType::~LogicalType(&local_48);
  LogicalType::LogicalType(&local_48,DATE);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::date_t>
            (in_RDI,&local_48);
  LogicalType::~LogicalType(&local_48);
  LogicalType::LogicalType(&local_48,TIMESTAMP);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::timestamp_t>
            (in_RDI,&local_48);
  LogicalType::~LogicalType(&local_48);
  LogicalType::LogicalType(&local_48,TIMESTAMP_TZ);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::timestamp_t>
            (in_RDI,&local_48);
  LogicalType::~LogicalType(&local_48);
  LogicalType::LogicalType(&local_48,BLOB);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::string_t>
            (in_RDI,&local_48);
  LogicalType::~LogicalType(&local_48);
  ArgMaxByTypes();
  for (by_type_00 = (element_type *)local_48._0_8_;
      by_type_00 !=
      local_48.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      by_type_00 = (element_type *)&(by_type_00->alias)._M_string_length) {
    AddDecimalArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
              (in_RDI,(LogicalType *)by_type_00);
  }
  LogicalType::LogicalType(&local_30,ANY);
  AddVectorArgMinMaxFunctionBy<duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>,duckdb::string_t>
            (in_RDI,&local_30);
  LogicalType::~LogicalType(&local_30);
  AddGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::GenericArgMinMaxState<(duckdb::OrderType)2>>>
            (in_RDI);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
  return in_RDI;
}

Assistant:

AggregateFunctionSet ArgMinNullFun::GetFunctions() {
	AggregateFunctionSet fun;
	AddArgMinMaxFunctions<LessThan, false, OrderType::ASCENDING>(fun);
	return fun;
}